

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image2D.h
# Opt level: O0

void __thiscall Image2D::Image2D(Image2D *this)

{
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::ofstream::ofstream(in_RDI + 0x30);
  return;
}

Assistant:

explicit Image2D() {}